

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O0

Parser * __thiscall Catch::clara::detail::Parser::operator|(Parser *this,Help *other)

{
  Parser *this_00;
  Parser *in_RDX;
  Parser *in_RDI;
  Opt *in_stack_ffffffffffffff48;
  Parser *this_01;
  Parser *in_stack_ffffffffffffff70;
  
  this_01 = in_RDI;
  Parser(in_stack_ffffffffffffff70,in_RDX);
  this_00 = operator|=(this_01,in_stack_ffffffffffffff48);
  Parser(this_00,in_RDX);
  ~Parser(this_01);
  return in_RDI;
}

Assistant:

auto operator|( T const &other ) const -> Parser {
            return Parser( *this ) |= other;
        }